

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ProceduralCheckerStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ProceduralCheckerStatement,std::span<slang::ast::Symbol_const*,18446744073709551615ul>,slang::SourceRange>
          (BumpAllocator *this,span<const_slang::ast::Symbol_*,_18446744073709551615UL> *args,
          SourceRange *args_1)

{
  SourceRange sourceRange;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> instances;
  ProceduralCheckerStatement *pPVar1;
  pointer in_RDX;
  __extent_storage<18446744073709551615UL> in_RSI;
  span<const_slang::ast::Symbol_*,_18446744073709551615UL> *in_stack_ffffffffffffffc8;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *in_stack_ffffffffffffffd0;
  SourceLocation in_stack_ffffffffffffffd8;
  SourceLocation in_stack_ffffffffffffffe0;
  
  pPVar1 = (ProceduralCheckerStatement *)
           allocate((BumpAllocator *)in_stack_ffffffffffffffd8,(size_t)in_stack_ffffffffffffffd0,
                    (size_t)in_stack_ffffffffffffffc8);
  std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::
  span<const_slang::ast::Symbol_*,_18446744073709551615UL>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  instances._M_extent._M_extent_value = in_RSI._M_extent_value;
  instances._M_ptr = in_RDX;
  sourceRange.endLoc = in_stack_ffffffffffffffe0;
  sourceRange.startLoc = in_stack_ffffffffffffffd8;
  ast::ProceduralCheckerStatement::ProceduralCheckerStatement
            ((ProceduralCheckerStatement *)in_RDX[1],instances,sourceRange);
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }